

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conway-cubes.cpp
# Opt level: O1

hypercube_t<char> *
hypercubify<char>(hypercube_t<char> *__return_storage_ptr__,rect_t<char> *in,size_t N)

{
  pointer *ppvVar1;
  pointer pvVar2;
  ulong uVar3;
  vector<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
  local_48;
  cube_t<char> local_30;
  
  local_48.
  super__Vector_base<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_48.
                         super__Vector_base<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,0x2e);
  make<4ul,char>(__return_storage_ptr__,N,(char *)&local_48);
  cubify<char>(&local_30,in,N);
  uVar3 = N >> 1;
  pvVar2 = (__return_storage_ptr__->
           super__Vector_base<std::vector<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::vector<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_48.
  super__Vector_base<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       pvVar2[uVar3].
       super__Vector_base<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  ppvVar1 = (pointer *)
            ((long)&pvVar2[uVar3].
                    super__Vector_base<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
                    ._M_impl.super__Vector_impl_data + 8);
  local_48.
  super__Vector_base<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = *ppvVar1;
  local_48.
  super__Vector_base<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = ppvVar1[1];
  pvVar2[uVar3].
  super__Vector_base<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_30.
       super__Vector_base<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)
   ((long)&pvVar2[uVar3].
           super__Vector_base<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data + 8) =
       local_30.
       super__Vector_base<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)
   ((long)&pvVar2[uVar3].
           super__Vector_base<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data + 0x10) =
       local_30.
       super__Vector_base<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_30.
  super__Vector_base<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_30.
  super__Vector_base<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_30.
  super__Vector_base<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_48);
  std::
  vector<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_30);
  return __return_storage_ptr__;
}

Assistant:

hypercube_t<T> hypercubify(const rect_t<T>& in, size_t N) {
  auto hcube = make<4>(N, '.');
  hcube[N/2] = cubify<T>(in, N);
  return hcube;
}